

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O2

int __thiscall embree::FastAllocator::unshare(FastAllocator *this,int __flags)

{
  long lVar1;
  void *ptr;
  PrimRef *pPVar2;
  undefined4 in_register_00000034;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000034,__flags);
  reset(this);
  lVar1 = puVar3[3];
  ptr = (void *)puVar3[4];
  if (ptr != (void *)0x0) {
    if ((ulong)(lVar1 << 5) < 0x1c00000) {
      alignedFree(ptr);
    }
    else {
      os_free(ptr,lVar1 << 5,*(bool *)(puVar3 + 1));
    }
  }
  if (lVar1 != 0) {
    (*(code *)**(undefined8 **)*puVar3)((undefined8 *)*puVar3,lVar1 * -0x20,1);
  }
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  *puVar3 = (this->primrefarray).alloc.device;
  *(bool *)(puVar3 + 1) = (this->primrefarray).alloc.hugepages;
  puVar3[2] = (this->primrefarray).size_active;
  (this->primrefarray).size_active = 0;
  puVar3[3] = (this->primrefarray).size_alloced;
  (this->primrefarray).size_alloced = 0;
  pPVar2 = (this->primrefarray).items;
  puVar3[4] = pPVar2;
  (this->primrefarray).items = (PrimRef *)0x0;
  return (int)pPVar2;
}

Assistant:

void unshare(mvector<PrimRef>& primrefarray_o)
    {
      reset(); // this removes blocks that are allocated inside the shared primref array
      primrefarray_o = std::move(primrefarray);
    }